

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_GammaCorrection(GammaCorrectionForm2 GammaCorrection)

{
  byte bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  byte *pbVar5;
  code *in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [16];
  uint8_t corrected;
  double value;
  double gamma;
  double a;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  uint8_t value_00;
  undefined4 in_stack_ffffffffffffff40;
  ushort uVar9;
  uint8_t in_stack_ffffffffffffff46;
  undefined1 uVar10;
  uint8_t in_stack_ffffffffffffff47;
  undefined1 uVar11;
  undefined8 in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_38;
  Image *in_stack_ffffffffffffffe0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffe8;
  
  auVar8 = in_ZMM0._0_16_;
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  value_00 = (uint8_t)(in_stack_ffffffffffffff3c >> 0x18);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46
            );
  Test_Helper::uniformImages(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d5d80);
  uVar2 = Test_Helper::randomValue<unsigned_int>(0x1d5d8a);
  auVar8 = vcvtusi2sd_avx512f(auVar8,uVar2);
  auVar7._0_8_ = auVar8._0_8_ / 100.0;
  auVar7._8_8_ = auVar8._8_8_;
  auVar8 = auVar7;
  uVar2 = Test_Helper::randomValue<unsigned_int>(0x1d5db6);
  auVar8 = vcvtusi2sd_avx512f(auVar8,uVar2);
  dVar6 = auVar8._0_8_ / 100.0;
  this = &local_38;
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  (*in_RDI)(auVar7._0_8_,dVar6,pvVar3,pvVar4);
  pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &stack0xffffffffffffffe0,0);
  dVar6 = pow((double)*pbVar5 / 255.0,dVar6);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar7._0_8_ * dVar6;
  auVar8 = vfmadd213sd_fma(ZEXT816(0x406fe00000000000),auVar8,ZEXT816(0x3fe0000000000000));
  if (256.0 <= auVar8._0_8_) {
    uVar9 = 0xff;
  }
  else {
    uVar9 = (ushort)(int)auVar8._0_8_ & 0xff;
  }
  uVar11 = 0;
  uVar10 = 0;
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::operator[](&local_38,1);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(uVar11,CONCAT16(uVar10,CONCAT24(uVar9,
                                                  in_stack_ffffffffffffff40))),value_00);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form2_GammaCorrection(GammaCorrectionForm2 GammaCorrection)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const double a     = randomValue <uint32_t>( 100 ) / 100.0;
        const double gamma = randomValue <uint32_t>( 300 ) / 100.0;

        GammaCorrection( input[0], input[1], a, gamma );

        const double value = a * pow( intensity[0] / 255.0, gamma ) * 255 + 0.5;
        const uint8_t corrected = (value < 256) ? static_cast<uint8_t>(value) : 255;

        return verifyImage( input[1], corrected );
    }